

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

wchar_t valid_options_item(menu *menu,wchar_t oid)

{
  ulong uVar1;
  size_t line;
  wchar_t oid_local;
  menu *menu_local;
  
  uVar1 = (ulong)oid;
  if (uVar1 < 0x11) {
    menu_local._4_4_ = L'\x01';
  }
  else if (uVar1 == 0x11) {
    menu_local._4_4_ = L'\0';
  }
  else if (uVar1 - 0x12 < 3) {
    menu_local._4_4_ = L'\x01';
  }
  else {
    menu_local._4_4_ = L'\0';
  }
  return menu_local._4_4_;
}

Assistant:

static int valid_options_item(struct menu *menu, int oid)
{
	size_t line = (size_t) oid;

	if (line < N_ELEMENTS(sval_dependent))
		return 1;

	/* Separator - blank line. */
	if (line == N_ELEMENTS(sval_dependent))
		return 0;

	line = line - N_ELEMENTS(sval_dependent) - 1;

	if (line < N_ELEMENTS(extra_item_options))
		return 1;

	return 0;
}